

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O1

void __thiscall
Reducer::tryToRemoveFunctions(std::vector<wasm::Name,std::allocator<wasm::Name>>)::
FunctionReferenceRemover::FunctionReferenceRemover(std::vector<wasm::Name,std::allocator<wasm::
Name>_>__(void *this,vector<wasm::Name,_std::allocator<wasm::Name>_> *vec)

{
  pointer pNVar1;
  pointer pNVar2;
  __hashtable *__h;
  undefined4 uStack_58;
  undefined4 uStack_54;
  Name name;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)((long)this + 8) = 0;
  *(undefined8 *)((long)this + 0xb0) = 0;
  *(undefined8 *)((long)this + 0xb8) = 0;
  *(undefined8 *)((long)this + 0xc0) = 0;
  *(undefined8 *)((long)this + 200) = 0;
  *(undefined8 *)((long)this + 0xd0) = 0;
  *(long *)((long)this + 0xd8) = (long)this + 0x108;
  *(undefined8 *)((long)this + 0xe0) = 1;
  *(undefined8 *)((long)this + 0xe8) = 0;
  *(undefined8 *)((long)this + 0xf0) = 0;
  *(undefined4 *)((long)this + 0xf8) = 0x3f800000;
  *(undefined8 *)((long)this + 0x100) = 0;
  *(undefined8 *)((long)this + 0x108) = 0;
  *(undefined8 *)((long)this + 0x110) = 0;
  *(undefined8 *)((long)this + 0x118) = 0;
  *(undefined8 *)((long)this + 0x120) = 0;
  pNVar2 = (vec->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pNVar1 = (vec->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pNVar2 != pNVar1) {
    do {
      uStack_58 = (undefined4)(pNVar2->super_IString).str._M_len;
      uStack_54 = *(undefined4 *)((long)&(pNVar2->super_IString).str._M_len + 4);
      name.super_IString.str._M_len._0_4_ = *(undefined4 *)&(pNVar2->super_IString).str._M_str;
      name.super_IString.str._M_len._4_4_ =
           *(undefined4 *)((long)&(pNVar2->super_IString).str._M_str + 4);
      name.super_IString.str._M_str = (char *)((long)this + 0xd8);
      std::
      _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)((long)this + 0xd8),&uStack_58,&name.super_IString.str._M_str);
      pNVar2 = pNVar2 + 1;
    } while (pNVar2 != pNVar1);
  }
  return;
}

Assistant:

FunctionReferenceRemover(std::vector<Name>& vec) {
        for (auto name : vec) {
          names.insert(name);
        }
      }